

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O1

int __thiscall OpenMD::IndexFinder::init(IndexFinder *this,EVP_PKEY_CTX *ctx)

{
  ulong *puVar1;
  int iVar2;
  pointer ppAVar3;
  long lVar4;
  pointer ppRVar5;
  pointer ppBVar6;
  pointer ppBVar7;
  pointer ppTVar8;
  pointer ppIVar9;
  Molecule *pMVar10;
  ulong uVar11;
  Atom *pAVar12;
  ulong uVar13;
  RigidBody *pRVar14;
  Bond *pBVar15;
  Bend *pBVar16;
  Torsion *pTVar17;
  Inversion *pIVar18;
  ulong uVar19;
  pointer ppAVar20;
  pointer ppRVar21;
  pointer ppBVar22;
  pointer ppBVar23;
  pointer ppTVar24;
  pointer ppIVar25;
  MoleculeIterator mi;
  SelectionSet ss;
  MoleculeIterator local_68;
  vector<int,_std::allocator<int>_> local_60;
  SelectionSet local_48;
  
  local_68._M_node = (_Base_ptr)0x0;
  pMVar10 = SimInfo::beginMolecule(this->info_,&local_68);
  if (pMVar10 != (Molecule *)0x0) {
    do {
      std::vector<int,_std::allocator<int>_>::vector(&local_60,&this->nObjects_);
      SelectionSet::SelectionSet(&local_48,&local_60);
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar11 = (ulong)pMVar10->globalIndex_;
      uVar19 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar19 = uVar11;
      }
      puVar1 = (ulong *)(((long)uVar19 >> 6) * 8 +
                         (long)local_48.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start[5].bitset_.
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + -8
                        + (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)pMVar10->globalIndex_ & 0x3f);
      ppAVar20 = (pMVar10->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar3 = (pMVar10->atoms_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar20 == ppAVar3) {
        pAVar12 = (Atom *)0x0;
      }
      else {
        pAVar12 = *ppAVar20;
      }
      if (pAVar12 != (Atom *)0x0) {
        lVar4 = (long)((local_48.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          ppAVar20 = ppAVar20 + 1;
          iVar2 = (pAVar12->super_StuntDouble).globalIndex_;
          uVar13 = (ulong)iVar2;
          uVar19 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar19 = uVar13;
          }
          puVar1 = (ulong *)(lVar4 + ((long)uVar19 >> 6) * 8 + -8 +
                            (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
          if (ppAVar20 == ppAVar3) {
            pAVar12 = (Atom *)0x0;
          }
          else {
            pAVar12 = *ppAVar20;
          }
        } while (pAVar12 != (Atom *)0x0);
      }
      ppRVar21 = (pMVar10->rigidBodies_).
                 super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppRVar5 = (pMVar10->rigidBodies_).
                super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppRVar21 == ppRVar5) {
        pRVar14 = (RigidBody *)0x0;
      }
      else {
        pRVar14 = *ppRVar21;
      }
      if (pRVar14 != (RigidBody *)0x0) {
        lVar4 = (long)((local_48.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          ppRVar21 = ppRVar21 + 1;
          iVar2 = (pRVar14->super_StuntDouble).globalIndex_;
          uVar13 = (ulong)iVar2;
          uVar19 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar19 = uVar13;
          }
          puVar1 = (ulong *)(lVar4 + ((long)uVar19 >> 6) * 8 + -8 +
                            (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
          if (ppRVar21 == ppRVar5) {
            pRVar14 = (RigidBody *)0x0;
          }
          else {
            pRVar14 = *ppRVar21;
          }
        } while (pRVar14 != (RigidBody *)0x0);
      }
      ppBVar22 = (pMVar10->bonds_).
                 super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppBVar6 = (pMVar10->bonds_).
                super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppBVar22 == ppBVar6) {
        pBVar15 = (Bond *)0x0;
      }
      else {
        pBVar15 = *ppBVar22;
      }
      if (pBVar15 != (Bond *)0x0) {
        lVar4 = (long)local_48.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].bitset_.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          ppBVar22 = ppBVar22 + 1;
          iVar2 = (pBVar15->super_ShortRangeInteraction).globalIndex_;
          uVar13 = (ulong)iVar2;
          uVar19 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar19 = uVar13;
          }
          puVar1 = (ulong *)(lVar4 + ((long)uVar19 >> 6) * 8 + -8 +
                            (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
          if (ppBVar22 == ppBVar6) {
            pBVar15 = (Bond *)0x0;
          }
          else {
            pBVar15 = *ppBVar22;
          }
        } while (pBVar15 != (Bond *)0x0);
      }
      ppBVar23 = (pMVar10->bends_).
                 super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppBVar7 = (pMVar10->bends_).
                super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppBVar23 == ppBVar7) {
        pBVar16 = (Bend *)0x0;
      }
      else {
        pBVar16 = *ppBVar23;
      }
      if (pBVar16 != (Bend *)0x0) {
        lVar4 = (long)local_48.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].bitset_.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          ppBVar23 = ppBVar23 + 1;
          iVar2 = (pBVar16->super_ShortRangeInteraction).globalIndex_;
          uVar13 = (ulong)iVar2;
          uVar19 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar19 = uVar13;
          }
          puVar1 = (ulong *)(lVar4 + ((long)uVar19 >> 6) * 8 + -8 +
                            (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
          if (ppBVar23 == ppBVar7) {
            pBVar16 = (Bend *)0x0;
          }
          else {
            pBVar16 = *ppBVar23;
          }
        } while (pBVar16 != (Bend *)0x0);
      }
      ppTVar24 = (pMVar10->torsions_).
                 super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppTVar8 = (pMVar10->torsions_).
                super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppTVar24 == ppTVar8) {
        pTVar17 = (Torsion *)0x0;
      }
      else {
        pTVar17 = *ppTVar24;
      }
      if (pTVar17 != (Torsion *)0x0) {
        lVar4 = (long)local_48.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start[3].bitset_.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          ppTVar24 = ppTVar24 + 1;
          iVar2 = (pTVar17->super_ShortRangeInteraction).globalIndex_;
          uVar13 = (ulong)iVar2;
          uVar19 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar19 = uVar13;
          }
          puVar1 = (ulong *)(lVar4 + ((long)uVar19 >> 6) * 8 + -8 +
                            (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
          if (ppTVar24 == ppTVar8) {
            pTVar17 = (Torsion *)0x0;
          }
          else {
            pTVar17 = *ppTVar24;
          }
        } while (pTVar17 != (Torsion *)0x0);
      }
      ppIVar25 = (pMVar10->inversions_).
                 super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppIVar9 = (pMVar10->inversions_).
                super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppIVar25 == ppIVar9) {
        pIVar18 = (Inversion *)0x0;
      }
      else {
        pIVar18 = *ppIVar25;
      }
      if (pIVar18 != (Inversion *)0x0) {
        lVar4 = (long)local_48.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start[4].bitset_.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          ppIVar25 = ppIVar25 + 1;
          iVar2 = (pIVar18->super_ShortRangeInteraction).globalIndex_;
          uVar13 = (ulong)iVar2;
          uVar19 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar19 = uVar13;
          }
          puVar1 = (ulong *)(lVar4 + ((long)uVar19 >> 6) * 8 + -8 +
                            (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
          if (ppIVar25 == ppIVar9) {
            pIVar18 = (Inversion *)0x0;
          }
          else {
            pIVar18 = *ppIVar25;
          }
        } while (pIVar18 != (Inversion *)0x0);
      }
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
                (&(this->selectionSets_).
                  super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar11].bitsets_,&local_48.bitsets_);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_48.bitsets_);
      pMVar10 = SimInfo::nextMolecule(this->info_,&local_68);
    } while (pMVar10 != (Molecule *)0x0);
  }
  return (int)pMVar10;
}

Assistant:

void IndexFinder::init() {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      SelectionSet ss(nObjects_);

      ss.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        ss.bitsets_[BOND].setBitOn(bond->getGlobalIndex());
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        ss.bitsets_[BEND].setBitOn(bend->getGlobalIndex());
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        ss.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        ss.bitsets_[INVERSION].setBitOn(inversion->getGlobalIndex());
      }

      selectionSets_[mol->getGlobalIndex()] = ss;
    }
  }